

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBufferToImage::Support::Support
          (Support *this,ResourceDescription *resourceDesc,AccessMode mode)

{
  VkQueueFlags VVar1;
  bool local_2d;
  AccessMode mode_local;
  ResourceDescription *resourceDesc_local;
  Support *this_local;
  
  OperationSupport::OperationSupport(&this->super_OperationSupport);
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__Support_016b3100;
  this->m_mode = mode;
  local_2d = false;
  if (resourceDesc->type == RESOURCE_TYPE_IMAGE) {
    local_2d = ::vk::isDepthStencilFormat(resourceDesc->imageFormat);
  }
  VVar1 = 4;
  if (local_2d != false) {
    VVar1 = 1;
  }
  this->m_requiredQueueFlags = VVar1;
  return;
}

Assistant:

Support (const ResourceDescription& resourceDesc, const AccessMode mode)
		: m_mode				(mode)
		, m_requiredQueueFlags	(resourceDesc.type == RESOURCE_TYPE_IMAGE && isDepthStencilFormat(resourceDesc.imageFormat) ? VK_QUEUE_GRAPHICS_BIT : VK_QUEUE_TRANSFER_BIT)
	{
		// From spec:
		//   Because depth or stencil aspect buffer to image copies may require format conversions on some implementations,
		//   they are not supported on queues that do not support graphics.

		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || resourceDesc.type != RESOURCE_TYPE_BUFFER);
		DE_ASSERT(m_mode == ACCESS_MODE_WRITE || resourceDesc.type != RESOURCE_TYPE_IMAGE);
	}